

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void parseOptions(int *argc,char ***argv,string *fileArg,string *fileExt)

{
  ulong uVar1;
  string *psVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  istream *piVar7;
  ostream *poVar8;
  char **extraout_RAX;
  char **ppcVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  double dVar12;
  bool boolBuffer;
  int intBuffer;
  char sep;
  string stringBuffer;
  CLOParser cop;
  stringstream ss;
  bool local_231;
  uint local_230;
  char local_229;
  int local_228;
  int local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  int local_1f4;
  string *local_1f0;
  int *local_1e8;
  string *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8;
  undefined7 uStack_1b7;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  byte abStack_198 [96];
  ios_base local_138 [264];
  
  local_228 = 1;
  iVar6 = *argc;
  local_224 = 1;
  local_1f0 = fileExt;
  local_1e0 = fileArg;
  if (1 < iVar6) {
    local_224 = 1;
    do {
      local_1d8.field_2._M_allocated_capacity = (size_type)*argv;
      local_1d8._M_dataplus._M_p = (pointer)&local_228;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      pbVar11 = &local_1d8;
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_1d8._M_string_length._0_4_ = iVar6;
      bVar5 = CLOParser::getOption<int>((CLOParser *)&local_1d8,"-h --help",(int *)0x0,false);
      if (bVar5) {
        printHelp((int *)pbVar11,argv,local_1f0);
LAB_001bff9d:
        exit(0);
      }
      pbVar11 = &local_1d8;
      bVar5 = CLOParser::getOption<int>((CLOParser *)&local_1d8,"--help-all",(int *)0x0,false);
      if (bVar5) {
        printLongHelp((int *)pbVar11,argv,local_1f0);
        goto LAB_001bff9d;
      }
      bVar5 = CLOParser::getOption<int>
                        ((CLOParser *)&local_1d8,"-n --n-of-solutions",(int *)&local_230,false);
      if (bVar5) {
        so.nof_solutions = local_230;
        uVar4 = so.verbosity;
      }
      else {
        bVar5 = CLOParser::getOption<int>
                          ((CLOParser *)&local_1d8,"-t --time-out",(int *)&local_230,false);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"WARNING: the --time-out flag has recently been changed."
                     ,0x37);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "The time-out is now provided in milliseconds instead of seconds",0x3f);
          local_1b8 = (stringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,(char *)&local_1b8,1);
          so.time_out.__r = (rep)(int)local_230;
          uVar4 = so.verbosity;
        }
        else {
          bVar5 = CLOParser::getOption<int>
                            ((CLOParser *)&local_1d8,"-r --rnd-seed",(int *)&local_230,false);
          if (bVar5) {
            so.rnd_seed = local_230;
            uVar4 = so.verbosity;
          }
          else {
            bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"-v --verbose",&local_231);
            if (bVar5) {
              uVar4 = (uint)local_231;
            }
            else {
              bVar5 = CLOParser::getOption<int>
                                ((CLOParser *)&local_1d8,"--verbosity",(int *)&local_230,false);
              uVar4 = local_230;
              if (!bVar5) {
                bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--print-sol",&local_231);
                if (bVar5) {
                  so.print_sol = local_231;
                  uVar4 = so.verbosity;
                }
                else {
                  bVar5 = CLOParser::getOption<std::__cxx11::string>
                                    ((CLOParser *)&local_1d8,"--restart",&local_220,false);
                  if (bVar5) {
                    iVar6 = std::__cxx11::string::compare((char *)&local_220);
                    if (iVar6 == 0) {
                      so.restart_type = CHUFFED_DEFAULT;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)&local_220);
                      if (iVar6 == 0) {
                        so.restart_type = NONE;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)&local_220);
                        if (iVar6 == 0) {
                          so.restart_type = CONSTANT;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)&local_220);
                          if (iVar6 == 0) {
                            so.restart_type = LINEAR;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)&local_220);
                            if (iVar6 == 0) {
                              so.restart_type = LUBY;
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)&local_220);
                              if (iVar6 == 0) {
                                so.restart_type = GEOMETRIC;
                              }
                              else {
                                local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)std::operator<<((ostream *)&std::cerr,**argv);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200->_M_local_buf,
                                           ": Unknown restart strategy ",0x1b);
                                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                   ((ostream *)local_200->_M_local_buf,
                                                    local_220._M_dataplus._M_p,
                                                    local_220._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar8,". Chuffed will use its default strategy.\n",0x29)
                                ;
                              }
                            }
                          }
                        }
                      }
                    }
                    so.restart_type_override = false;
                    uVar4 = so.verbosity;
                  }
                  else {
                    bVar5 = CLOParser::getOption<int>
                                      ((CLOParser *)&local_1d8,"--restart-scale",(int *)&local_230,
                                       false);
                    if (bVar5) {
                      so.restart_scale = local_230;
                      so.restart_scale_override = false;
                      uVar4 = so.verbosity;
                    }
                    else {
                      bVar5 = CLOParser::getOption<std::__cxx11::string>
                                        ((CLOParser *)&local_1d8,"--restart-base",&local_220,false);
                      if (bVar5) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "WARNING: the --restart-base flag has recently been changed.",
                                   0x3b);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "The old behaviour of \"restart base\" is now implemented by --restart-scale."
                                   ,0x4a);
                        local_1b8 = (stringstream)0xa;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)&local_1b8,1);
                        local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_220._M_dataplus._M_p;
                        local_1e8 = __errno_location();
                        local_1f4 = *local_1e8;
                        *local_1e8 = 0;
                        dVar12 = strtod(local_200->_M_local_buf,(char **)&local_1b8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(uStack_1b7,local_1b8) == local_200) {
LAB_001c0033:
                          std::__throw_invalid_argument("stod");
                        }
                        else {
                          if (*local_1e8 == 0) {
                            *local_1e8 = local_1f4;
LAB_001bf490:
                            so.restart_base = dVar12;
                            if (1.0 <= dVar12) {
                              so.restart_base_override = false;
                              uVar4 = so.verbosity;
                              goto LAB_001bf1cc;
                            }
                            parseOptions();
                            goto LAB_001c0033;
                          }
                          if (*local_1e8 != 0x22) goto LAB_001bf490;
                        }
                        std::__throw_out_of_range("stod");
LAB_001c004b:
                        parseOptions();
                        ppcVar9 = extraout_RAX;
LAB_001c0050:
                        poVar8 = std::operator<<((ostream *)&std::cerr,*ppcVar9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,": unrecognized option ",0x16);
                        poVar8 = std::operator<<(poVar8,(*argv)[local_228]);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                        poVar8 = std::operator<<((ostream *)&std::cerr,**argv);
                        std::operator<<(poVar8,": use --help for more information.\n");
                        goto LAB_001bfdd1;
                      }
                      bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--toggle-vsids",&local_231
                                                );
                      if (bVar5) {
                        so.toggle_vsids = local_231;
                        uVar4 = so.verbosity;
                      }
                      else {
                        bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--branch-random",
                                                   &local_231);
                        if (!bVar5) {
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"--switch-to-vsids-after",
                                             (int *)&local_230,false);
                          if (bVar5) {
                            so.switch_to_vsids_after = local_230;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"--sat-polarity",
                                             (int *)&local_230,false);
                          if (bVar5) {
                            so.sat_polarity = local_230;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--sbps",&local_231);
                          if (bVar5) {
                            so.sbps = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--prop-fifo",
                                                     &local_231);
                          if (bVar5) {
                            so.prop_fifo = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--disj-edge-find",
                                                     &local_231);
                          if (bVar5) {
                            so.disj_edge_find = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--disj-set-bp",
                                                     &local_231);
                          if (bVar5) {
                            so.disj_set_bp = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--cumu-global",
                                                     &local_231);
                          if (bVar5) {
                            so.cumu_global = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--sat-simplify",
                                                     &local_231);
                          if (bVar5) {
                            so.sat_simplify = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--fd-simplify",
                                                     &local_231);
                          if (bVar5) {
                            so.fd_simplify = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--lazy",&local_231);
                          if (bVar5) {
                            so.lazy = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--finesse",&local_231)
                          ;
                          if (bVar5) {
                            so.finesse = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--learn",&local_231);
                          if (bVar5) {
                            so.learn = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--vsids",&local_231);
                          if (bVar5) {
                            so.vsids = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--sort-learnt-level",
                                                     &local_231);
                          if (bVar5) {
                            so.sort_learnt_level = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--one-watch",
                                                     &local_231);
                          if (bVar5) {
                            so.one_watch = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--exclude-introduced",
                                                     &local_231);
                          if (bVar5) {
                            so.exclude_introduced = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--decide-introduced",
                                                     &local_231);
                          if (bVar5) {
                            so.decide_introduced = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,
                                                     "--introduced-heuristic",&local_231);
                          if (bVar5) {
                            so.introduced_heuristic = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,
                                                     "--use-var-is-introduced",&local_231);
                          if (bVar5) {
                            so.use_var_is_introduced = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--print-nodes",
                                                     &local_231);
                          if (bVar5) {
                            so.print_nodes = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--print-variable-list"
                                                     ,&local_231);
                          if (bVar5) {
                            so.print_variable_list = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--print-implications",
                                                     &local_231);
                          if (bVar5) {
                            so.print_implications = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--send-skipped",
                                                     &local_231);
                          if (bVar5) {
                            so.send_skipped = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<std::__cxx11::string>
                                            ((CLOParser *)&local_1d8,"--filter-domains",&local_220,
                                             false);
                          if (bVar5) {
                            std::__cxx11::string::_M_assign((string *)&so.filter_domains);
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--learnt-stats",
                                                     &local_231);
                          if (bVar5) {
                            so.learnt_stats = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--learnt-stats-nogood"
                                                     ,&local_231);
                          if (bVar5) {
                            so.learnt_stats_nogood = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--debug",&local_231);
                          if (bVar5) {
                            so.debug = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--exhaustive-activity"
                                                     ,&local_231);
                          if (bVar5) {
                            so.exhaustive_activity = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--bin-clause-opt",
                                                     &local_231);
                          if (bVar5) {
                            so.bin_clause_opt = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--assump-int",
                                                     &local_231);
                          if (bVar5) {
                            so.assump_int = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"--eager-limit",
                                             (int *)&local_230,false);
                          if (bVar5) {
                            so.eager_limit = local_230;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"--sat-var-limit",
                                             (int *)&local_230,false);
                          if (bVar5) {
                            so.sat_var_limit = local_230;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"--n-of-learnts",
                                             (int *)&local_230,false);
                          if (bVar5) {
                            so.nof_learnts = local_230;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"--learnts-mlimit",
                                             (int *)&local_230,false);
                          if (bVar5) {
                            so.learnts_mlimit = local_230;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--lang-ext-linear",
                                                     &local_231);
                          if (bVar5) {
                            so.lang_ext_linear = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--mdd",&local_231);
                          if (bVar5) {
                            so.mdd = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--mip",&local_231);
                          if (bVar5) {
                            so.mip = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--mip-branch",
                                                     &local_231);
                          if (bVar5) {
                            so.mip_branch = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--sym-static",
                                                     &local_231);
                          if (bVar5) {
                            so.sym_static = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--ldsb",&local_231);
                          if (bVar5) {
                            so.ldsb = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--ldsbta",&local_231);
                          if (bVar5) {
                            so.ldsbta = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--ldsbad",&local_231);
                          if (bVar5) {
                            so.ldsbad = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getBool((CLOParser *)&local_1d8,"--well-founded",
                                                     &local_231);
                          if (bVar5) {
                            so.well_founded = local_231;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"-a",(int *)0x0,false);
                          if (bVar5) {
                            so.nof_solutions = 0;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"-f",(int *)0x0,false);
                          if (bVar5) {
                            so.toggle_vsids = true;
                            so.restart_scale = 100;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<int>
                                            ((CLOParser *)&local_1d8,"-s -S",(int *)0x0,false);
                          if (bVar5) {
                            so.verbosity = 1;
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          bVar5 = CLOParser::getOption<std::__cxx11::string>
                                            ((CLOParser *)&local_1d8,"--cp-profiler",&local_220,
                                             false);
                          if (bVar5) {
                            std::__cxx11::stringstream::stringstream
                                      (&local_1b8,(string *)&local_220,_S_out|_S_in);
                            piVar7 = (istream *)
                                     std::istream::operator>>
                                               ((istream *)&local_1b8,&so.cpprofiler_id);
                            piVar7 = std::operator>>(piVar7,&local_229);
                            std::istream::operator>>((istream *)piVar7,&so.cpprofiler_port);
                            if ((local_229 == ',') &&
                               ((abStack_198[*(long *)(CONCAT71(uStack_1b7,local_1b8) + -0x18)] & 2)
                                != 0)) {
                              so.cpprofiler_enabled = true;
                              std::__cxx11::stringstream::~stringstream(&local_1b8);
                              std::ios_base::~ios_base(local_138);
                              uVar4 = so.verbosity;
                              goto LAB_001bf1cc;
                            }
                            goto LAB_001c004b;
                          }
                          ppcVar9 = *argv;
                          if (*ppcVar9[local_228] != '-') {
                            lVar10 = (long)local_224;
                            local_224 = local_224 + 1;
                            ppcVar9[lVar10] = ppcVar9[local_228];
                            uVar4 = so.verbosity;
                            goto LAB_001bf1cc;
                          }
                          goto LAB_001c0050;
                        }
                        so.branch_random = local_231;
                        uVar4 = so.verbosity;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_001bf1cc:
      so.verbosity = uVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      local_228 = local_228 + 1;
      iVar6 = *argc;
    } while (local_228 < iVar6);
  }
  psVar2 = local_1e0;
  *argc = local_224;
  if (local_1e0 == (string *)0x0) {
LAB_001bfe3a:
    if ((byte)(so.ldsbta + so.ldsbad + so.ldsb + so.sym_static) < 2) {
      if (((so.ldsbta | so.ldsbad) & 1U) != 0) {
        so.ldsb = true;
      }
      if ((so.ldsb == true) && (so.lazy == false)) goto LAB_001bffa9;
      if ((so.mip_branch != true) || (so.mip != false)) {
        if (so.vsids == true) {
          (*((engine.branching)->super_Branching)._vptr_Branching[3])(engine.branching,&sat);
        }
        if (so.learnt_stats_nogood == true) {
          so.learnt_stats = true;
        }
        if (so.sbps == true) {
          if (((so.vsids == false) && (so.toggle_vsids == false)) &&
             (999999999 < so.switch_to_vsids_after)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "WARNING: SBPS value selection must be used with an activity-based search to optimize its efficiency."
                       ,100);
            local_1b8 = (stringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)&local_1b8,1);
          }
          if ((so.restart_type == NONE) || (so.restart_scale == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "WARNING: SBPS value selection must be used with restarts to optimize its efficiency."
                       ,0x54);
            local_1b8 = (stringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)&local_1b8,1);
          }
        }
        return;
      }
    }
    else {
      parseOptions();
LAB_001bffa9:
      parseOptions();
    }
    parseOptions();
  }
  else {
    if (local_224 != 2) {
      if (2 < local_224) {
        poVar8 = std::operator<<((ostream *)&std::cerr,**argv);
        std::operator<<(poVar8,": more than one file argument not supported\n");
        poVar8 = std::operator<<((ostream *)&std::cerr,**argv);
        std::operator<<(poVar8,": use --help for more information.\n");
        goto LAB_001bfdd1;
      }
      goto LAB_001bfe3a;
    }
    std::__cxx11::string::string((string *)&local_1b8,(*argv)[1],(allocator *)&local_220);
    uVar3 = local_1b0;
    if (local_1f0->_M_string_length == 0) {
LAB_001bfe11:
      std::__cxx11::string::_M_assign((string *)psVar2);
      *argc = *argc + -1;
      if ((undefined1 *)CONCAT71(uStack_1b7,local_1b8) != local_1a8) {
        operator_delete((undefined1 *)CONCAT71(uStack_1b7,local_1b8));
      }
      goto LAB_001bfe3a;
    }
    uVar1 = local_1f0->_M_string_length + 1;
    bVar5 = true;
    if (uVar1 < local_1b0) {
      std::__cxx11::string::substr((ulong)&local_220,(ulong)&local_1b8);
      std::operator+(&local_1d8,".",local_1f0);
      if (local_220._M_string_length ==
          CONCAT44(local_1d8._M_string_length._4_4_,(int)local_1d8._M_string_length)) {
        if (local_220._M_string_length == 0) {
          bVar5 = false;
        }
        else {
          iVar6 = bcmp(local_220._M_dataplus._M_p,local_1d8._M_dataplus._M_p,
                       local_220._M_string_length);
          bVar5 = iVar6 != 0;
        }
      }
    }
    if (uVar1 < uVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
    }
    if (!bVar5) goto LAB_001bfe11;
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,**argv);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,": cannot handle file extension for ",0x23);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)CONCAT71(uStack_1b7,local_1b8),local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::operator<<((ostream *)&std::cerr,**argv);
  std::operator<<(poVar8,": use --help for more information.\n");
LAB_001bfdd1:
  exit(1);
}

Assistant:

void parseOptions(int& argc, char**& argv, std::string* fileArg, const std::string& fileExt) {
	int j = 1;
	for (int i = 1; i < argc; i++) {
		CLOParser cop(i, argc, argv);
		int intBuffer;
		bool boolBuffer;
		std::string stringBuffer;
		if (cop.get("-h --help")) {
			printHelp(argc, argv, fileExt);
			std::exit(EXIT_SUCCESS);
		}
		if (cop.get("--help-all")) {
			printLongHelp(argc, argv, fileExt);
			std::exit(EXIT_SUCCESS);
		}
		if (cop.get("-n --n-of-solutions", &intBuffer)) {
			so.nof_solutions = intBuffer;
		} else if (cop.get("-t --time-out", &intBuffer)) {
			// TODO: Remove warning when appropriate
			std::cerr << "WARNING: the --time-out flag has recently been changed."
								<< "The time-out is now provided in milliseconds instead of seconds" << '\n';
			so.time_out = duration(intBuffer);
		} else if (cop.get("-r --rnd-seed", &intBuffer)) {
			so.rnd_seed = intBuffer;
		} else if (cop.getBool("-v --verbose", boolBuffer)) {
			so.verbosity = static_cast<int>(boolBuffer);
		} else if (cop.get("--verbosity", &intBuffer)) {
			so.verbosity = intBuffer;
		} else if (cop.getBool("--print-sol", boolBuffer)) {
			so.print_sol = boolBuffer;
		} else if (cop.get("--restart", &stringBuffer)) {
			if (stringBuffer == "chuffed") {
				so.restart_type = CHUFFED_DEFAULT;
			} else if (stringBuffer == "none") {
				so.restart_type = NONE;
			} else if (stringBuffer == "constant") {
				so.restart_type = CONSTANT;
			} else if (stringBuffer == "linear") {
				so.restart_type = LINEAR;
			} else if (stringBuffer == "luby") {
				so.restart_type = LUBY;
			} else if (stringBuffer == "geometric") {
				so.restart_type = GEOMETRIC;
			} else {
				std::cerr << argv[0] << ": Unknown restart strategy " << stringBuffer
									<< ". Chuffed will use its default strategy.\n";
			}
			so.restart_type_override = false;
		} else if (cop.get("--restart-scale", &intBuffer)) {
			so.restart_scale = static_cast<unsigned int>(intBuffer);
			so.restart_scale_override = false;
		} else if (cop.get("--restart-base", &stringBuffer)) {
			// TODO: Remove warning when appropriate
			std::cerr << "WARNING: the --restart-base flag has recently been changed."
								<< "The old behaviour of \"restart base\" is now implemented by --restart-scale."
								<< '\n';
			so.restart_base = stod(stringBuffer);
			if (so.restart_base < 1.0) {
				CHUFFED_ERROR("Illegal restart base. Restart count will converge to zero.");
			}
			so.restart_base_override = false;
		} else if (cop.getBool("--toggle-vsids", boolBuffer)) {
			so.toggle_vsids = boolBuffer;
		} else if (cop.getBool("--branch-random", boolBuffer)) {
			so.branch_random = boolBuffer;
		} else if (cop.get("--switch-to-vsids-after", &intBuffer)) {
			so.switch_to_vsids_after = intBuffer;
		} else if (cop.get("--sat-polarity", &intBuffer)) {
			so.sat_polarity = intBuffer;
		} else if (cop.getBool("--sbps", boolBuffer)) {
			so.sbps = boolBuffer;
		} else if (cop.getBool("--prop-fifo", boolBuffer)) {
			so.prop_fifo = boolBuffer;
		} else if (cop.getBool("--disj-edge-find", boolBuffer)) {
			so.disj_edge_find = boolBuffer;
		} else if (cop.getBool("--disj-set-bp", boolBuffer)) {
			so.disj_set_bp = boolBuffer;
		} else if (cop.getBool("--cumu-global", boolBuffer)) {
			so.cumu_global = boolBuffer;
		} else if (cop.getBool("--sat-simplify", boolBuffer)) {
			so.sat_simplify = boolBuffer;
		} else if (cop.getBool("--fd-simplify", boolBuffer)) {
			so.fd_simplify = boolBuffer;
		} else if (cop.getBool("--lazy", boolBuffer)) {
			so.lazy = boolBuffer;
		} else if (cop.getBool("--finesse", boolBuffer)) {
			so.finesse = boolBuffer;
		} else if (cop.getBool("--learn", boolBuffer)) {
			so.learn = boolBuffer;
		} else if (cop.getBool("--vsids", boolBuffer)) {
			so.vsids = boolBuffer;
		} else if (cop.getBool("--sort-learnt-level", boolBuffer)) {
			so.sort_learnt_level = boolBuffer;
		} else if (cop.getBool("--one-watch", boolBuffer)) {
			so.one_watch = boolBuffer;
		} else if (cop.getBool("--exclude-introduced", boolBuffer)) {
			so.exclude_introduced = boolBuffer;
		} else if (cop.getBool("--decide-introduced", boolBuffer)) {
			so.decide_introduced = boolBuffer;
		} else if (cop.getBool("--introduced-heuristic", boolBuffer)) {
			so.introduced_heuristic = boolBuffer;
		} else if (cop.getBool("--use-var-is-introduced", boolBuffer)) {
			so.use_var_is_introduced = boolBuffer;
		} else if (cop.getBool("--print-nodes", boolBuffer)) {
			so.print_nodes = boolBuffer;
		} else if (cop.getBool("--print-variable-list", boolBuffer)) {
			so.print_variable_list = boolBuffer;
		} else if (cop.getBool("--print-implications", boolBuffer)) {
			so.print_implications = boolBuffer;
		} else if (cop.getBool("--send-skipped", boolBuffer)) {
			so.send_skipped = boolBuffer;
		} else if (cop.get("--filter-domains", &stringBuffer)) {
			so.filter_domains = stringBuffer;
		} else if (cop.getBool("--learnt-stats", boolBuffer)) {
			so.learnt_stats = boolBuffer;
		} else if (cop.getBool("--learnt-stats-nogood", boolBuffer)) {
			so.learnt_stats_nogood = boolBuffer;
		} else if (cop.getBool("--debug", boolBuffer)) {
			so.debug = boolBuffer;
		} else if (cop.getBool("--exhaustive-activity", boolBuffer)) {
			so.exhaustive_activity = boolBuffer;
		} else if (cop.getBool("--bin-clause-opt", boolBuffer)) {
			so.bin_clause_opt = boolBuffer;
		} else if (cop.getBool("--assump-int", boolBuffer)) {
			so.assump_int = boolBuffer;
		} else if (cop.get("--eager-limit", &intBuffer)) {
			so.eager_limit = intBuffer;
		} else if (cop.get("--sat-var-limit", &intBuffer)) {
			so.sat_var_limit = intBuffer;
		} else if (cop.get("--n-of-learnts", &intBuffer)) {
			so.nof_learnts = intBuffer;
		} else if (cop.get("--learnts-mlimit", &intBuffer)) {
			so.learnts_mlimit = intBuffer;
		} else if (cop.getBool("--lang-ext-linear", boolBuffer)) {
			so.lang_ext_linear = boolBuffer;
		} else if (cop.getBool("--mdd", boolBuffer)) {
			so.mdd = boolBuffer;
		} else if (cop.getBool("--mip", boolBuffer)) {
			so.mip = boolBuffer;
		} else if (cop.getBool("--mip-branch", boolBuffer)) {
			so.mip_branch = boolBuffer;
		} else if (cop.getBool("--sym-static", boolBuffer)) {
			so.sym_static = boolBuffer;
		} else if (cop.getBool("--ldsb", boolBuffer)) {
			so.ldsb = boolBuffer;
		} else if (cop.getBool("--ldsbta", boolBuffer)) {
			so.ldsbta = boolBuffer;
		} else if (cop.getBool("--ldsbad", boolBuffer)) {
			so.ldsbad = boolBuffer;
		} else if (cop.getBool("--well-founded", boolBuffer)) {
			so.well_founded = boolBuffer;
		} else if (cop.get("-a")) {
			so.nof_solutions = 0;
		} else if (cop.get("-f")) {
			so.toggle_vsids = true;
			so.restart_scale = 100;
		} else if (cop.get("-s -S")) {
			so.verbosity = 1;
#ifdef HAS_PROFILER
		} else if (cop.get("--cp-profiler", &stringBuffer)) {
			std::stringstream ss(stringBuffer);
			char sep;
			ss >> so.cpprofiler_id >> sep >> so.cpprofiler_port;
			if (sep == ',' && ss.eof()) {
				so.cpprofiler_enabled = true;
			} else {
				CHUFFED_ERROR("Invalid value for --cp-profiler.");
			}
#endif
		} else if (argv[i][0] == '-') {
			std::cerr << argv[0] << ": unrecognized option " << argv[i] << "\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		} else {
			argv[j++] = argv[i];
		}
	}

	argc = j;

	if (fileArg != nullptr) {
		if (argc == 2) {
			const std::string filename(argv[1]);
			if (!fileExt.empty()) {
				if (filename.size() <= fileExt.size() + 1 ||
						filename.substr(filename.size() - fileExt.size() - 1) != "." + fileExt) {
					std::cerr << argv[0] << ": cannot handle file extension for " << filename << "\n";
					std::cerr << argv[0] << ": use --help for more information.\n";
					std::exit(EXIT_FAILURE);
				}
			}
			*fileArg = filename;
			--argc;
		} else if (argc > 2) {
			std::cerr << argv[0] << ": more than one file argument not supported\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		}
	}

	rassert(so.sym_static + so.ldsb + so.ldsbta + so.ldsbad <= 1);

	if (so.ldsbta || so.ldsbad) {
		so.ldsb = true;
	}
	if (so.ldsb) {
		rassert(so.lazy);
	}
	if (so.mip_branch) {
		rassert(so.mip);
	}
	if (so.vsids) {
		engine.branching->add(&sat);
	}

	if (so.learnt_stats_nogood) {
		so.learnt_stats = true;
	}

	// Warn user if SBPS is not used with an activity-based search and restarts
	if (so.sbps) {
		if (!(so.vsids || so.toggle_vsids || so.switch_to_vsids_after < 1000000000)) {
			std::cerr << "WARNING: SBPS value selection must be used with an activity-based search to "
									 "optimize its "
									 "efficiency."
								<< '\n';
		}
		if (so.restart_type == NONE || so.restart_scale == 0) {
			std::cerr << "WARNING: SBPS value selection must be used with restarts to optimize its "
									 "efficiency."
								<< '\n';
		}
	}
}